

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O1

int __thiscall
LASwriteItemCompressed_RGB14_v3::init(LASwriteItemCompressed_RGB14_v3 *this,EVP_PKEY_CTX *ctx)

{
  U32 context;
  ByteStreamOutArray *pBVar1;
  U8 *pUVar2;
  ArithmeticEncoder *this_00;
  long lVar3;
  undefined7 extraout_var;
  U32 *in_RDX;
  
  pBVar1 = this->outstream_RGB;
  if (pBVar1 == (ByteStreamOutArray *)0x0) {
    pBVar1 = (ByteStreamOutArray *)operator_new(0x40);
    (pBVar1->super_ByteStreamOut).bit_buffer = 0;
    (pBVar1->super_ByteStreamOut).num_buffer = 0;
    (pBVar1->super_ByteStreamOut)._vptr_ByteStreamOut = (_func_int **)&PTR_putByte_0015f358;
    pUVar2 = (U8 *)malloc(0x1000);
    pBVar1->data = pUVar2;
    pBVar1->alloc = 0x1000;
    pBVar1->size = 0;
    pBVar1->curr = 0;
    (pBVar1->super_ByteStreamOut)._vptr_ByteStreamOut = (_func_int **)&PTR_putByte_0015f3f0;
    pBVar1[1].super_ByteStreamOut._vptr_ByteStreamOut = (_func_int **)0x0;
    this->outstream_RGB = pBVar1;
    this_00 = (ArithmeticEncoder *)operator_new(0x30);
    ArithmeticEncoder::ArithmeticEncoder(this_00);
    this->enc_RGB = this_00;
  }
  else {
    (*(pBVar1->super_ByteStreamOut)._vptr_ByteStreamOut[10])(pBVar1,0);
  }
  ArithmeticEncoder::init(this->enc_RGB,(EVP_PKEY_CTX *)this->outstream_RGB);
  this->changed_RGB = false;
  lVar3 = 0x30;
  do {
    *(undefined1 *)((long)this->contexts[0].last_item + lVar3 + -0x32) = 1;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x130);
  context = *in_RDX;
  this->current_context = context;
  createAndInitModelsAndCompressors(this,context,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASwriteItemCompressed_RGB14_v3::init(const U8* item, U32& context)
{
  /* on the first init create outstreams and encoders */

  if (outstream_RGB == 0)
  {
    /* create outstreams */

    if (IS_LITTLE_ENDIAN())
    {
      outstream_RGB = new ByteStreamOutArrayLE();
    }
    else
    {
      outstream_RGB = new ByteStreamOutArrayBE();
    }

    /* create layer encoders */

    enc_RGB = new ArithmeticEncoder();
  }
  else
  {
    /* otherwise just seek back */

    outstream_RGB->seek(0);
  }
  
  /* init layer encoders */

  enc_RGB->init(outstream_RGB);

  /* set changed booleans to FALSE */

  changed_RGB = FALSE;

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 writer

  /* create and init entropy models and integer compressors (and init contect from item) */

  createAndInitModelsAndCompressors(current_context, item);

  return TRUE;
}